

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O2

void __thiscall
FuzzingParameterSet::set_distribution
          (FuzzingParameterSet *this,Range<int> range_N_sided,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *probabilities)

{
  size_type sVar1;
  mapped_type *pmVar2;
  param_type local_88;
  undefined1 auStack_58 [8];
  vector<int,_std::allocator<int>_> dd;
  mapped_type local_34;
  
  auStack_58 = (undefined1  [8])0x0;
  dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  for (local_88._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_ = 0;
      (int)local_88._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start <= range_N_sided.max;
      local_88._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           (int)local_88._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + 1) {
    sVar1 = std::
            _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&probabilities->_M_h,(key_type_conflict *)&local_88);
    if (sVar1 == 0) {
      local_34 = 0;
    }
    else {
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)probabilities,(key_type *)&local_88);
      local_34 = *pmVar2;
    }
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)auStack_58,&local_34);
  }
  std::discrete_distribution<int>::param_type::
  param_type<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&local_88,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)auStack_58
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start);
  std::discrete_distribution<int>::param_type::operator=
            ((param_type *)
             (dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage + 0x514),&local_88);
  std::discrete_distribution<int>::param_type::~param_type(&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)auStack_58);
  return;
}

Assistant:

void FuzzingParameterSet::set_distribution(Range<int> range_N_sided, std::unordered_map<int, int> probabilities) {
  std::vector<int> dd;
  for (int i = 0; i <= range_N_sided.max; i += 1) {
    dd.push_back((probabilities.count(i) > 0) ? probabilities.at(i) : (int) 0);
  }
  N_sided_probabilities = std::discrete_distribution<int>(dd.begin(), dd.end());
}